

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void btSoftBody::PSolve_Links(btSoftBody *psb,btScalar kst,btScalar ti)

{
  long in_RDI;
  float in_XMM0_Da;
  btVector3 bVar1;
  btScalar k;
  btScalar len;
  btVector3 del;
  Node *b;
  Node *a;
  Link *l;
  int ni;
  int i;
  btScalar local_6c;
  btVector3 *in_stack_ffffffffffffff98;
  btScalar in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  btVector3 local_58;
  float local_48;
  btScalar local_44;
  btScalar local_40 [4];
  Node *local_30;
  Node *local_28;
  Link *local_20;
  int local_18;
  int local_14;
  float local_c;
  long local_8;
  
  local_14 = 0;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  local_18 = btAlignedObjectArray<btSoftBody::Link>::size
                       ((btAlignedObjectArray<btSoftBody::Link> *)(in_RDI + 0x390));
  for (; local_14 < local_18; local_14 = local_14 + 1) {
    local_20 = btAlignedObjectArray<btSoftBody::Link>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Link> *)(local_8 + 0x390),local_14);
    if (0.0 < local_20->m_c0) {
      local_28 = local_20->m_n[0];
      local_30 = local_20->m_n[1];
      local_40 = (btScalar  [4])
                 operator-((btVector3 *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
      local_44 = btVector3::length2((btVector3 *)0x27c0a9);
      if (1.1920929e-07 < local_20->m_c1 + local_44) {
        local_48 = ((local_20->m_c1 - local_44) / (local_20->m_c0 * (local_20->m_c1 + local_44))) *
                   local_c;
        in_stack_ffffffffffffffa4 = local_48 * local_28->m_im;
        local_58 = ::operator*((btVector3 *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                               in_stack_ffffffffffffff98->m_floats);
        btVector3::operator-=(&local_28->m_x,&local_58);
        bVar1 = ::operator*((btVector3 *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98->m_floats);
        local_6c = bVar1.m_floats[0];
        in_stack_ffffffffffffff98 = bVar1.m_floats._4_8_;
        in_stack_ffffffffffffffa0 = bVar1.m_floats[3];
        btVector3::operator+=(&local_30->m_x,(btVector3 *)&local_6c);
      }
    }
  }
  return;
}

Assistant:

void				btSoftBody::PSolve_Links(btSoftBody* psb,btScalar kst,btScalar ti)
{
	for(int i=0,ni=psb->m_links.size();i<ni;++i)
	{			
		Link&	l=psb->m_links[i];
		if(l.m_c0>0)
		{
			Node&			a=*l.m_n[0];
			Node&			b=*l.m_n[1];
			const btVector3	del=b.m_x-a.m_x;
			const btScalar	len=del.length2();
			if (l.m_c1+len > SIMD_EPSILON)
			{
				const btScalar	k=((l.m_c1-len)/(l.m_c0*(l.m_c1+len)))*kst;
				a.m_x-=del*(k*a.m_im);
				b.m_x+=del*(k*b.m_im);
			}
		}
	}
}